

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O1

void __thiscall
MeshDenoisingBase::getFaceNeighbor
          (MeshDenoisingBase *this,TriMesh *mesh,FaceHandle fh,FaceNeighborType face_neighbor_type,
          vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *face_neighbor)

{
  int *this_00;
  pointer *ppFVar1;
  pointer pFVar2;
  iterator iVar3;
  value_type vVar4;
  value_type start;
  BaseHandle BVar5;
  Face *pFVar6;
  _Rb_tree_node_base *p_Var7;
  BaseHandle local_b0;
  undefined1 local_98 [8];
  VertexFaceIter vf_it;
  FaceFaceIter ff_it;
  undefined1 local_48 [8];
  FaceVertexIter fv_it;
  
  pFVar2 = (face_neighbor->
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((face_neighbor->
      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish != pFVar2) {
    (face_neighbor->super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pFVar2;
  }
  if (face_neighbor_type == kVertexBased) {
    ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ = &ff_it;
    ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ = 0;
    ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
         (BaseHandle)0x0;
    ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
         (BaseHandle)0x0;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
    pFVar6 = OpenMesh::ArrayKernel::face((ArrayKernel *)mesh,(FaceHandle)fh.super_BaseHandle.idx_);
    fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
         (pFVar6->halfedge_handle_).super_BaseHandle.idx_;
    fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
         (BaseHandle)0x0;
    fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
         (BaseHandle)0xffffffff;
    local_48 = (undefined1  [8])mesh;
    fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
         (int)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
    if ((int)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ != -1) {
      do {
        if (((int)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
             fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
           (fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
            idx_ != 0)) break;
        start = OpenMesh::Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                             *)local_48);
        OpenMesh::Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
        ::GenericCirculatorT
                  ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)local_98,(mesh_ref)mesh,(VertexHandle)start.super_BaseHandle.idx_,false);
        while ((vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
               (((int)vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
                 vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
                (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                 super_BaseHandle.idx_ == 0))))) {
          BVar5.idx_ = (int)OpenMesh::Iterators::
                            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                                         *)local_98);
          if ((BaseHandle)BVar5.idx_ != fh.super_BaseHandle.idx_) {
            local_b0.idx_ =
                 (int)OpenMesh::Iterators::
                      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                      ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                                   *)local_98);
            vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.
            idx_ = (BaseHandle)(BaseHandle)local_b0.idx_;
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>
                      ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)&vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                           lap_counter_,(int *)&local_b0);
          }
          OpenMesh::Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
          ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                        *)&local_b0,
                       (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                        *)local_98,0);
        }
        OpenMesh::Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                      *)local_98,
                     (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                      *)local_48,0);
      } while (fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
    }
    if ((FaceFaceIter *)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ !=
        &ff_it) {
      p_Var7 = (_Rb_tree_node_base *)
               ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_;
      do {
        local_48._0_4_ = p_Var7[1]._M_color;
        iVar3._M_current =
             (face_neighbor->
             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (face_neighbor->
            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
          _M_realloc_insert<OpenMesh::FaceHandle>(face_neighbor,iVar3,(FaceHandle *)local_48);
        }
        else {
          ((iVar3._M_current)->super_BaseHandle).idx_ = p_Var7[1]._M_color;
          ppFVar1 = &(face_neighbor->
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar1 = *ppFVar1 + 1;
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      } while (p_Var7 != (_Rb_tree_node_base *)&ff_it);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
  }
  else if ((face_neighbor_type == kEdgeBased) &&
          (OpenMesh::Iterators::
           GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
           ::GenericCirculatorT
                     ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                       *)&vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                          lap_counter_,(mesh_ref)mesh,(FaceHandle)fh.super_BaseHandle.idx_,false),
          ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1)) {
    this_00 = &vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
    do {
      if (((int)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
           ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) {
        return;
      }
      vVar4 = OpenMesh::Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                           *)this_00);
      local_48._0_4_ = vVar4.super_BaseHandle.idx_;
      iVar3._M_current =
           (face_neighbor->
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (face_neighbor->
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
        _M_realloc_insert<OpenMesh::FaceHandle>(face_neighbor,iVar3,(FaceHandle *)local_48);
      }
      else {
        ((iVar3._M_current)->super_BaseHandle).idx_ = (int)vVar4.super_BaseHandle.idx_;
        ppFVar1 = &(face_neighbor->
                   super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppFVar1 = *ppFVar1 + 1;
      }
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                    *)local_48,
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                    *)this_00,0);
    } while (ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
  }
  return;
}

Assistant:

void MeshDenoisingBase::getFaceNeighbor(TriMesh &mesh, TriMesh::FaceHandle fh, FaceNeighborType face_neighbor_type, std::vector<TriMesh::FaceHandle> &face_neighbor)
{
    face_neighbor.clear();
    if(face_neighbor_type == kEdgeBased)
    {
        for(TriMesh::FaceFaceIter ff_it = mesh.ff_iter(fh); ff_it.is_valid(); ff_it++)
            face_neighbor.push_back(*ff_it);
    }
    else if(face_neighbor_type == kVertexBased)
    {
        std::set<int> neighbor_face_index; neighbor_face_index.clear();

        for(TriMesh::FaceVertexIter fv_it = mesh.fv_begin(fh); fv_it.is_valid(); fv_it++)
        {
            for(TriMesh::VertexFaceIter vf_it = mesh.vf_iter(*fv_it); vf_it.is_valid(); vf_it++)
            {
                if((*vf_it) != fh)
                    neighbor_face_index.insert(vf_it->idx());
            }
        }

        for(std::set<int>::iterator iter = neighbor_face_index.begin(); iter != neighbor_face_index.end(); ++ iter)
        {
            face_neighbor.push_back(TriMesh::FaceHandle(*iter));
        }
    }
}